

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryWriter::write<std::pair<float,float>,std::allocator<std::pair<float,float>>,void,void>
          (BinaryWriter *this,
          vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *t)

{
  long lVar1;
  unsigned_long uVar2;
  bool bVar3;
  unsigned_long local_28;
  
  uVar2 = (long)(t->
                super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(t->
                super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_28 = uVar2;
  write<unsigned_long>(this,&local_28);
  lVar1 = 0;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    write<std::pair<float,float>>
              (this,(pair<float,_float> *)
                    ((long)&((t->
                             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->first + lVar1));
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }